

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

void __thiscall Assimp::XGLImporter::ReadMaterial(XGLImporter *this,TempScope *scope)

{
  pointer *pppaVar1;
  iterator __position;
  TempScope *pTVar2;
  bool bVar3;
  int iVar4;
  aiMaterial *this_00;
  mapped_type *ppaVar5;
  uint mat_id;
  aiMaterial *mat;
  float f;
  uint local_74;
  TempScope *local_70;
  aiMaterial *local_68;
  float local_5c [3];
  string local_50;
  
  local_70 = scope;
  local_74 = ReadIDAttr(this);
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  local_68 = this_00;
  bVar3 = ReadElementUpToClosing(this,"mat");
  if (bVar3) {
    do {
      GetElementName_abi_cxx11_(&local_50,this);
      iVar4 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar4 == 0) {
        ReadCol3((XGLImporter *)local_5c);
        aiMaterial::AddBinaryProperty
                  (this_00,(XGLImporter *)local_5c,0xc,"$clr.ambient",0,0,aiPTI_Float);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar4 == 0) {
          ReadCol3((XGLImporter *)local_5c);
          aiMaterial::AddBinaryProperty
                    (this_00,(XGLImporter *)local_5c,0xc,"$clr.diffuse",0,0,aiPTI_Float);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar4 == 0) {
            ReadCol3((XGLImporter *)local_5c);
            aiMaterial::AddBinaryProperty
                      (this_00,(XGLImporter *)local_5c,0xc,"$clr.specular",0,0,aiPTI_Float);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_50);
            if (iVar4 == 0) {
              ReadCol3((XGLImporter *)local_5c);
              aiMaterial::AddBinaryProperty
                        (this_00,(XGLImporter *)local_5c,0xc,"$clr.emissive",0,0,aiPTI_Float);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_50);
              if (iVar4 == 0) {
                local_5c[0] = ReadFloat(this);
                aiMaterial::AddBinaryProperty
                          (this_00,(XGLImporter *)local_5c,4,"$mat.opacity",0,0,aiPTI_Float);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_50);
                if (iVar4 == 0) {
                  local_5c[0] = ReadFloat(this);
                  aiMaterial::AddBinaryProperty
                            (this_00,(XGLImporter *)local_5c,4,"$mat.shininess",0,0,aiPTI_Float);
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar3 = ReadElementUpToClosing(this,"mat");
    } while (bVar3);
  }
  pTVar2 = local_70;
  ppaVar5 = std::
            map<unsigned_int,_aiMaterial_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMaterial_*>_>_>
            ::operator[](&local_70->materials,&local_74);
  *ppaVar5 = this_00;
  __position._M_current =
       (pTVar2->materials_linear).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pTVar2->materials_linear).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
              ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&pTVar2->materials_linear,
               __position,&local_68);
  }
  else {
    *__position._M_current = this_00;
    pppaVar1 = &(pTVar2->materials_linear).
                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  return;
}

Assistant:

void XGLImporter::ReadMaterial(TempScope& scope) {
    const unsigned int mat_id = ReadIDAttr();

    aiMaterial *mat(new aiMaterial );
    while (ReadElementUpToClosing("mat"))  {
        const std::string& s = GetElementName();
        if (s == "amb") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_AMBIENT);
        }
        else if (s == "diff") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_DIFFUSE);
        }
        else if (s == "spec") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_SPECULAR);
        }
        else if (s == "emiss") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_EMISSIVE);
        }
        else if (s == "alpha") {
            const float f = ReadFloat();
            mat->AddProperty(&f,1,AI_MATKEY_OPACITY);
        }
        else if (s == "shine") {
            const float f = ReadFloat();
            mat->AddProperty(&f,1,AI_MATKEY_SHININESS);
        }
    }

    scope.materials[mat_id] = mat;
    scope.materials_linear.push_back(mat);
}